

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O2

void __thiscall gutil::Parameter::nextString(Parameter *this,string *s,char *opt)

{
  ulong uVar1;
  IOException *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = this->pos;
  if ((ulong)((long)(this->list).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->list).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar1) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&p,"There are no more values!",(allocator *)&local_90);
    IOException::IOException(pIVar2,&p);
    __cxa_throw(pIVar2,&IOException::typeinfo,Exception::~Exception);
  }
  if (opt != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_b0,opt,(allocator *)&local_50);
    std::operator+(&local_90,'|',&local_b0);
    std::operator+(&p,&local_90,'|');
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::operator+(&local_b0,'|',
                   (this->list).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->pos);
    std::operator+(&local_90,&local_b0,'|');
    uVar1 = std::__cxx11::string::find((string *)&p,(ulong)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    if (p._M_string_length <= uVar1) {
      pIVar2 = (IOException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_50,"Argument \'",
                     (this->list).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->pos);
      std::operator+(&local_b0,&local_50,"\' must be one of: ");
      std::operator+(&local_90,&local_b0,opt);
      IOException::IOException(pIVar2,&local_90);
      __cxa_throw(pIVar2,&IOException::typeinfo,Exception::~Exception);
    }
    std::__cxx11::string::~string((string *)&p);
    uVar1 = this->pos;
  }
  this->pos = uVar1 + 1;
  std::__cxx11::string::_M_assign((string *)s);
  return;
}

Assistant:

void Parameter::nextString(std::string &s, const char *opt)
{
  if (pos < list.size())
  {
    if (opt != 0)
    {
      std::string p='|'+std::string(opt)+'|';

      if (p.find('|'+list[pos]+'|') >= p.size())
      {
        throw IOException("Argument '"+list[pos]+"' must be one of: "+opt);
      }
    }

    s=list[pos++];
  }
  else
  {
    throw IOException("There are no more values!");
  }
}